

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::InsertBailOnNoProfile(IRBuilder *this,uint offset)

{
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  Type *ppIVar7;
  int iVar8;
  Type pIVar9;
  Type insertBeforeInstr;
  undefined1 local_40 [8];
  Iterator __iter;
  
  bVar4 = DoBailOnNoProfile(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x84,"(DoBailOnNoProfile())","DoBailOnNoProfile()");
    if (!bVar4) goto LAB_004c7ca0;
    *puVar6 = 0;
  }
  if (this->callTreeHasSomeProfileInfo == false) {
    local_40 = (undefined1  [8])this->m_argStack;
    __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar9 = (Type)0x0;
    iVar8 = 0;
    do {
      if (__iter.list == (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_004c7ca0;
        *puVar6 = 0;
      }
      auVar3 = local_40;
      pSVar1 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      insertBeforeInstr = pIVar9;
      if ((undefined1  [8])pSVar1 == local_40) break;
      __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)pSVar1;
      ppIVar7 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      insertBeforeInstr = *ppIVar7;
      iVar5 = iVar8 + 1;
    } while ((insertBeforeInstr->m_opcode != StartCall) ||
            (pIVar9 = insertBeforeInstr, iVar8 = iVar5, iVar5 < 2));
    if ((undefined1  [8])pSVar1 == auVar3) {
      if (insertBeforeInstr == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x9a,"(startCall)","startCall");
        if (!bVar4) {
LAB_004c7ca0:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      if (insertBeforeInstr->m_prev->m_opcode != BailOnNoProfile) {
        InsertBailOnNoProfile(this,insertBeforeInstr);
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::InsertBailOnNoProfile(uint offset)
{
    Assert(DoBailOnNoProfile());

    if (this->callTreeHasSomeProfileInfo)
    {
        return;
    }

    IR::Instr *startCall = nullptr;
    int count = 0;
    FOREACH_SLIST_ENTRY(IR::Instr *, argInstr, this->m_argStack)
    {
        if (argInstr->m_opcode == Js::OpCode::StartCall)
        {
            startCall = argInstr;
            count++;
            if (count > 1)
            {
                return;
            }
        }
    } NEXT_SLIST_ENTRY;

    AnalysisAssert(startCall);

    if (startCall->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
    {
        InsertBailOnNoProfile(startCall);
    }
}